

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O2

int mbedtls_pk_verify(mbedtls_pk_context *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,
                     uchar *sig,size_t sig_len)

{
  _func_int_void_ptr_mbedtls_md_type_t_uchar_ptr_size_t_uchar_ptr_size_t *UNRECOVERED_JUMPTABLE;
  int iVar1;
  int iVar2;
  size_t local_38;
  
  iVar2 = -16000;
  if ((ctx != (mbedtls_pk_context *)0x0) && (ctx->pk_info != (mbedtls_pk_info_t *)0x0)) {
    local_38 = hash_len;
    iVar1 = pk_hashlen_helper(md_alg,&local_38);
    if (iVar1 == 0) {
      UNRECOVERED_JUMPTABLE = ctx->pk_info->verify_func;
      if (UNRECOVERED_JUMPTABLE !=
          (_func_int_void_ptr_mbedtls_md_type_t_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) {
        iVar2 = (*UNRECOVERED_JUMPTABLE)(ctx->pk_ctx,md_alg,hash,local_38,sig,sig_len);
        return iVar2;
      }
      iVar2 = -0x3f00;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_pk_verify( mbedtls_pk_context *ctx, mbedtls_md_type_t md_alg,
               const unsigned char *hash, size_t hash_len,
               const unsigned char *sig, size_t sig_len )
{
    if( ctx == NULL || ctx->pk_info == NULL ||
        pk_hashlen_helper( md_alg, &hash_len ) != 0 )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ctx->pk_info->verify_func == NULL )
        return( MBEDTLS_ERR_PK_TYPE_MISMATCH );

    return( ctx->pk_info->verify_func( ctx->pk_ctx, md_alg, hash, hash_len,
                                       sig, sig_len ) );
}